

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

ServiceDescriptorProto * __thiscall
google::protobuf::ServiceDescriptorProto::New(ServiceDescriptorProto *this,Arena *arena)

{
  ServiceDescriptorProto *this_00;
  
  this_00 = (ServiceDescriptorProto *)operator_new(0x40);
  ServiceDescriptorProto(this_00);
  if (arena != (Arena *)0x0) {
    Arena::Own<google::protobuf::ServiceDescriptorProto>(arena,this_00);
  }
  return this_00;
}

Assistant:

ServiceDescriptorProto* ServiceDescriptorProto::New(::google::protobuf::Arena* arena) const {
  ServiceDescriptorProto* n = new ServiceDescriptorProto;
  if (arena != NULL) {
    arena->Own(n);
  }
  return n;
}